

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

void Gia_ManCorrSpecReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,int f,int nPrefix)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  Gia_Obj_t *pGVar8;
  
  pGVar8 = p->pObjs;
  if ((pObj < pGVar8) || (iVar2 = p->nObjs, pGVar8 + iVar2 <= pObj)) goto LAB_005a8fe2;
  iVar4 = (int)((long)pObj - (long)pGVar8 >> 2) * -0x55555555;
  uVar7 = iVar4 + iVar2 * f;
  if (((int)uVar7 < 0) || ((p->vCopies).nSize <= (int)uVar7)) {
LAB_005a8fc3:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((p->vCopies).pArray[uVar7] != -1) {
    return;
  }
  if (nPrefix <= f) {
    if (pObj < pGVar8) goto LAB_005a8fe2;
    uVar5 = (ulong)(uint)p->pReprs[iVar4] & 0xfffffff;
    if (uVar5 == 0xfffffff) {
      pGVar8 = (Gia_Obj_t *)0x0;
    }
    else {
      if (iVar2 <= (int)uVar5) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar8 = pGVar8 + uVar5;
    }
    if (pGVar8 != (Gia_Obj_t *)0x0) {
      Gia_ManCorrSpecReduce_rec(pNew,p,pGVar8,f,nPrefix);
      pGVar1 = p->pObjs;
      if (pGVar8 < pGVar1) goto LAB_005a8fe2;
      if (pGVar1 + p->nObjs <= pGVar8) goto LAB_005a8fe2;
      iVar2 = p->nObjs * f;
      uVar7 = (int)((ulong)((long)pGVar8 - (long)pGVar1) >> 2) * -0x55555555 + iVar2;
      if (((int)uVar7 < 0) || (iVar4 = (p->vCopies).nSize, iVar4 <= (int)uVar7)) goto LAB_005a8fc3;
      piVar6 = (p->vCopies).pArray;
      if (piVar6[uVar7] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_005a8fe2;
      uVar3 = iVar2 + (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555;
      if (((int)uVar3 < 0) || (iVar4 <= (int)uVar3)) goto LAB_005a9001;
      uVar7 = piVar6[uVar7] ^
              ((uint)((ulong)*(undefined8 *)pGVar8 >> 0x20) ^
              (uint)((ulong)*(undefined8 *)pObj >> 0x20)) >> 0x1f;
      goto LAB_005a8fb3;
    }
  }
  uVar7 = ~*(uint *)pObj;
  if (((uVar7 & 0x9fffffff) != 0) && ((int)*(uint *)pObj < 0 || (uVar7 & 0x1fffffff) == 0)) {
    __assert_fail("Gia_ObjIsCand(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                  ,0x5a,
                  "void Gia_ManCorrSpecReduce_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)")
    ;
  }
  uVar7 = Gia_ManCorrSpecReal(pNew,p,pObj,f,nPrefix);
  pGVar8 = p->pObjs;
  if ((pObj < pGVar8) || (pGVar8 + p->nObjs <= pObj)) {
LAB_005a8fe2:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar3 = (int)((ulong)((long)pObj - (long)pGVar8) >> 2) * -0x55555555 + p->nObjs * f;
  if (((int)uVar3 < 0) || ((p->vCopies).nSize <= (int)uVar3)) {
LAB_005a9001:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  piVar6 = (p->vCopies).pArray;
LAB_005a8fb3:
  piVar6[uVar3] = uVar7;
  return;
}

Assistant:

void Gia_ManCorrSpecReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int f, int nPrefix )
{
    Gia_Obj_t * pRepr;
    int iLitNew;
    if ( ~Gia_ObjCopyF(p, f, pObj) )
        return;
    if ( f >= nPrefix && (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        Gia_ManCorrSpecReduce_rec( pNew, p, pRepr, f, nPrefix );
        iLitNew = Abc_LitNotCond( Gia_ObjCopyF(p, f, pRepr), Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
        Gia_ObjSetCopyF( p, f, pObj, iLitNew );
        return;
    }
    assert( Gia_ObjIsCand(pObj) );
    iLitNew = Gia_ManCorrSpecReal( pNew, p, pObj, f, nPrefix );
    Gia_ObjSetCopyF( p, f, pObj, iLitNew );
}